

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O2

void DiffTestRecurse<Blob<256>,unsigned_long>
               (pfHash hash,Blob<256> *k1,Blob<256> *k2,unsigned_long *h1,unsigned_long *h2,
               int start,int bitsleft,vector<Blob<256>,_std::allocator<Blob<256>_>_> *diffs)

{
  Blob<256> local_50;
  
  while (start < 0x100) {
    flipbit(k2,0x20,start);
    (*hash)(k2,0x20,0,h2);
    if (*h1 == *h2) {
      Blob<256>::operator^(&local_50,k1,k2);
      std::vector<Blob<256>,std::allocator<Blob<256>>>::emplace_back<Blob<256>>
                ((vector<Blob<256>,std::allocator<Blob<256>>> *)diffs,&local_50);
    }
    if (bitsleft + -1 != 0) {
      DiffTestRecurse<Blob<256>,unsigned_long>(hash,k1,k2,h1,h2,start + 1U,bitsleft + -1,diffs);
    }
    flipbit(k2,0x20,start);
    start = start + 1U;
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}